

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O0

err_t g12sKeypairGen(octet *privkey,octet *pubkey,g12s_params *params,gen_i rng,void *rng_stack)

{
  bool_t bVar1;
  ulong n;
  gen_i rng_00;
  void *dest;
  void *count;
  long in_RCX;
  int *in_RDX;
  void *in_RSI;
  word *in_RDI;
  word *in_R8;
  void *stack;
  word *Q;
  word *d;
  ec_o *ec;
  size_t mo;
  size_t m;
  err_t code;
  long *rng_state;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar2;
  
  rng_state = (long *)0x0;
  if (in_RCX == 0) {
    eVar2 = 0x130;
  }
  else {
    eVar2 = g12sEcCreate((ec_o **)m,(g12s_params *)mo,(g12s_deep_i)ec);
    if (eVar2 == 0) {
      n = (ulong)(*in_RDX + 0x3fU >> 6);
      rng_00 = (gen_i)(ulong)(*in_RDX + 7U >> 3);
      bVar1 = memIsValid(in_RDI,(size_t)rng_00);
      if ((bVar1 == 0) ||
         (bVar1 = memIsValid(in_RSI,*(long *)(rng_state[3] + 0x38) << 1), bVar1 == 0)) {
        g12sEcClose((ec_o *)0x177cb1);
        eVar2 = 0x6d;
      }
      else {
        dest = (void *)((long)rng_state + n * 8 + *rng_state);
        count = (void *)((long)dest + *(long *)(rng_state[3] + 0x30) * 0x10);
        bVar1 = zzRandNZMod(in_R8,(word *)CONCAT44(eVar2,in_stack_ffffffffffffffc8),n,rng_00,
                            rng_state);
        if (bVar1 == 0) {
          g12sEcClose((ec_o *)0x177d37);
          eVar2 = 0x130;
        }
        else {
          bVar1 = ecMulA(Q,(word *)stack,
                         (ec_o *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,(size_t)in_RSI,in_RDX);
          if (bVar1 == 0) {
            g12sEcClose((ec_o *)0x177d79);
            eVar2 = 0x1f6;
          }
          else {
            u64To(dest,(size_t)count,(u64 *)0x177d9a);
            (**(code **)(rng_state[3] + 0x48))(in_RSI,dest,rng_state[3],count);
            (**(code **)(rng_state[3] + 0x48))
                      ((long)in_RSI + *(long *)(rng_state[3] + 0x38),
                       (void *)((long)dest + *(long *)(rng_state[3] + 0x30) * 8),rng_state[3],count)
            ;
            g12sEcClose((ec_o *)0x177e11);
            eVar2 = 0;
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t g12sKeypairGen(octet privkey[], octet pubkey[],
	const g12s_params* params, gen_i rng, void* rng_stack)
{
	err_t code;
	size_t m, mo;
	// состояние
	ec_o* ec = 0;
	word* d;				/* [m] личный ключ */
	word* Q;				/* [2n] открытый ключ */	
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = g12sEcCreate(&ec, params, g12sKeypairGen_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	m = W_OF_B(params->l);
	mo = O_OF_B(params->l);
	// проверить входные указатели
	if (!memIsValid(privkey, mo) || 
		!memIsValid(pubkey, 2 * ec->f->no))
	{
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + m;
	stack = Q + 2 * ec->f->n;
	// d <-R {1,2,..., q - 1}
	if (!zzRandNZMod(d, ec->order, m, rng, rng_stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_RNG;
	}
	// Q <- d P
	if (!ecMulA(Q, ec->base, ec, d, m, stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// выгрузить ключи
	wwTo(privkey, mo, d);
	qrTo(pubkey, ecX(Q), ec->f, stack);
	qrTo(pubkey + ec->f->no, ecY(Q, ec->f->n), ec->f, stack);
	// все нормально
	g12sEcClose(ec);
	return ERR_OK;
}